

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O0

void __thiscall Blip_Impulse_::fine_volume_unit(Blip_Impulse_ *this)

{
  undefined2 *puVar1;
  undefined2 *puVar2;
  long in_RDI;
  int n;
  imp_t *src2;
  imp_t *imp;
  imp_t *imp2;
  imp_t temp [1536];
  int local_c24;
  undefined2 *local_c20;
  undefined2 *local_c18;
  undefined2 *local_c10;
  undefined2 local_c08 [12];
  imp_t *in_stack_fffffffffffff410;
  int in_stack_fffffffffffff41c;
  Blip_Impulse_ *in_stack_fffffffffffff420;
  
  scale_impulse(in_stack_fffffffffffff420,in_stack_fffffffffffff41c,in_stack_fffffffffffff410);
  local_c10 = (undefined2 *)
              (*(long *)(in_RDI + 0x20) +
              (long)(*(int *)(in_RDI + 0x38) * 2 * *(int *)(in_RDI + 0x30)) * 2);
  scale_impulse(in_stack_fffffffffffff420,in_stack_fffffffffffff41c,in_stack_fffffffffffff410);
  local_c18 = *(undefined2 **)(in_RDI + 0x20);
  local_c20 = local_c08;
  local_c24 = (*(int *)(in_RDI + 0x38) / 2) * 2 * *(int *)(in_RDI + 0x30);
  while (local_c24 != 0) {
    puVar1 = local_c10 + 1;
    *local_c18 = *local_c10;
    local_c10 = local_c10 + 2;
    local_c18[1] = *puVar1;
    puVar1 = local_c20 + 1;
    puVar2 = local_c18 + 3;
    local_c18[2] = *local_c20;
    local_c20 = local_c20 + 2;
    local_c18 = local_c18 + 4;
    *puVar2 = *puVar1;
    local_c24 = local_c24 + -1;
  }
  return;
}

Assistant:

void Blip_Impulse_::fine_volume_unit()
{
	// to do: find way of merging in-place without temporary buffer
	
	imp_t temp [max_res * 2 * Blip_Buffer::widest_impulse_];
	scale_impulse( (offset & 0xffff) << fine_bits, temp );
	imp_t* imp2 = impulses + res * 2 * width;
	scale_impulse( offset & 0xffff, imp2 );
	
	// merge impulses
	imp_t* imp = impulses;
	imp_t* src2 = temp;
	for ( int n = res / 2 * 2 * width; n--; ) {
		*imp++ = *imp2++;
		*imp++ = *imp2++;
		*imp++ = *src2++;
		*imp++ = *src2++;
	}
}